

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

int lest::usage(ostream *os)

{
  ostream *os_local;
  
  std::operator<<(os,
                  "\nUsage: test [options] [test-spec ...]\n\nOptions:\n  -h, --help         this help message\n  -a, --abort        abort at first failure\n  -c, --count        count selected tests\n  -g, --list-tags    list tags of selected tests\n  -l, --list-tests   list selected tests\n  -p, --pass         also report passing tests\n  -z, --pass-zen     ... without expansion\n  -t, --time         list duration of selected tests\n  -v, --verbose      also report passing or failing sections\n  --order=declared   use source code test order (default)\n  --order=lexical    use lexical sort test order\n  --order=random     use random test order\n  --random-seed=n    use n for random generator seed\n  --random-seed=time use time for random generator seed\n  --repeat=n         repeat selected tests n times (-1: indefinite)\n  --version          report lest version and compiler used\n  --                 end options\n\nTest specification:\n  \"@\", \"*\" all tests, unless excluded\n  empty    all tests, unless tagged [hide] or [.optional-name]\n  \"text\"   select tests that contain text (case insensitive)\n  \"!text\"  omit tests that contain text (case insensitive)\n"
                 );
  return 0;
}

Assistant:

inline int usage( std::ostream & os )
{
    os <<
        "\nUsage: test [options] [test-spec ...]\n"
        "\n"
        "Options:\n"
        "  -h, --help         this help message\n"
        "  -a, --abort        abort at first failure\n"
        "  -c, --count        count selected tests\n"
        "  -g, --list-tags    list tags of selected tests\n"
        "  -l, --list-tests   list selected tests\n"
        "  -p, --pass         also report passing tests\n"
        "  -z, --pass-zen     ... without expansion\n"
        "  -t, --time         list duration of selected tests\n"
        "  -v, --verbose      also report passing or failing sections\n"
        "  --order=declared   use source code test order (default)\n"
        "  --order=lexical    use lexical sort test order\n"
        "  --order=random     use random test order\n"
        "  --random-seed=n    use n for random generator seed\n"
        "  --random-seed=time use time for random generator seed\n"
        "  --repeat=n         repeat selected tests n times (-1: indefinite)\n"
        "  --version          report lest version and compiler used\n"
        "  --                 end options\n"
        "\n"
        "Test specification:\n"
        "  \"@\", \"*\" all tests, unless excluded\n"
        "  empty    all tests, unless tagged [hide] or [.optional-name]\n"
#if lest_FEATURE_REGEX_SEARCH
        "  \"re\"     select tests that match regular expression\n"
        "  \"!re\"    omit tests that match regular expression\n"
#else
        "  \"text\"   select tests that contain text (case insensitive)\n"
        "  \"!text\"  omit tests that contain text (case insensitive)\n"
#endif
        ;
    return 0;
}